

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dic_compiler.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  char text [4096];
  char local_1038 [4104];
  
  if (argc < 2) {
    main_cold_1();
    iVar1 = -1;
  }
  else {
    iVar1 = feof(_stdin);
    if (iVar1 == 0) {
      do {
        __stream = _stdin;
        iVar1 = ferror(_stdin);
        if ((iVar1 != 0) || (pcVar2 = fgets(local_1038,0x1000,__stream), pcVar2 == (char *)0x0))
        break;
        sVar3 = strcspn(local_1038,"\r\n");
        local_1038[sVar3] = '\0';
        sVar3 = strcspn(local_1038,"\t");
        local_1038[sVar3] = '\0';
        uVar4 = strtoul(local_1038 + sVar3 + 1,(char **)0x0,10);
        dic_insert_word(local_1038,(uint)uVar4);
        iVar1 = feof(_stdin);
      } while (iVar1 == 0);
    }
    MAFSA::daciuk<29>::save_to_file(&dict,argv[1]);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
	if (2 > argc)
	{
		fprintf(stderr, "Usage: %s dictionary.dic\n", argv[0]);
		return -1;
	}

	while (!feof(stdin) && !ferror(stdin))
	{
		char text [4096];
		size_t size, tabs;

		if (NULL == fgets(text, 4096, stdin))
		{
			break;
		}

		size = strcspn(text, "\r\n");
		text[size] = 0;

		tabs = strcspn(text, "\t");
		text[tabs] = 0;

		dic_insert_word(text, strtoul(text + tabs + 1, NULL, 10));
	}

	dict.save_to_file(argv[1]);

	return 0;
}